

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint_casts.cpp
# Opt level: O3

string_t __thiscall
duckdb::IntToVarInt<unsigned_short>(duckdb *this,Vector *result,unsigned_short int_value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  undefined6 in_register_00000012;
  idx_t len;
  idx_t extraout_RDX;
  ulong uVar10;
  uint uVar11;
  char *blob_00;
  Vector *vector;
  undefined1 *puVar12;
  double dVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar36;
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar65;
  undefined1 auVar64 [16];
  int iVar66;
  long lVar67;
  long lVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long lVar76;
  long lVar77;
  string_t sVar78;
  string_t blob;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  long local_48;
  long lStack_40;
  
  len = CONCAT62(in_register_00000012,int_value);
  uVar9 = (ulong)result & 0xffffffff;
  if ((int)result == 0) {
    uVar11 = 1;
  }
  else {
    dVar13 = log2((double)((int)result + 1));
    dVar13 = ceil(dVar13 * 0.125);
    uVar11 = (uint)(long)dVar13;
    len = extraout_RDX;
  }
  vector = (Vector *)(ulong)(uVar11 + 3);
  local_68 = (undefined1  [16])StringVector::EmptyString((StringVector *)this,vector,len);
  blob_00 = local_68._8_8_;
  if (local_68._0_4_ < 0xd) {
    blob_00 = local_68 + 4;
  }
  Varint::SetHeader(blob_00,(ulong)uVar11,false);
  if (0 < (int)uVar11) {
    puVar12 = (undefined1 *)
              ((long)&vector[-1].auxiliary.internal.
                      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 4);
    uVar14 = (ulong)uVar11;
    lVar67 = uVar14 - 0xe;
    uVar10 = (ulong)uVar11;
    lVar75 = uVar10 - 0xf;
    lVar24 = uVar14 - 0xc;
    lVar25 = uVar10 - 0xd;
    lVar26 = uVar14 - 10;
    lVar27 = uVar10 - 0xb;
    lVar28 = uVar14 - 8;
    lVar29 = uVar10 - 9;
    lVar30 = uVar14 - 6;
    lVar31 = uVar10 - 7;
    lVar32 = uVar14 - 4;
    lVar33 = uVar10 - 5;
    lVar76 = uVar14 - 2;
    lVar77 = uVar10 - 3;
    lVar15 = uVar10 - 1;
    local_58._8_4_ = (int)puVar12;
    local_58._0_8_ = puVar12;
    local_58._12_4_ = (int)((ulong)puVar12 >> 0x20);
    uVar10 = 0;
    do {
      auVar64._8_4_ = (int)uVar10;
      auVar64._0_8_ = uVar10;
      auVar64._12_4_ = (int)(uVar10 >> 0x20);
      auVar37 = local_58 ^ _DAT_012acff0;
      auVar34 = (auVar64 | _DAT_012acfe0) ^ _DAT_012acff0;
      iVar65 = auVar37._0_4_;
      iVar41 = -(uint)(iVar65 < auVar34._0_4_);
      iVar66 = auVar37._4_4_;
      iVar52 = -(uint)(iVar66 < auVar34._4_4_);
      iVar39 = auVar37._8_4_;
      iVar53 = -(uint)(iVar39 < auVar34._8_4_);
      iVar40 = auVar37._12_4_;
      iVar54 = -(uint)(iVar40 < auVar34._12_4_);
      auVar68._4_4_ = iVar41;
      auVar68._0_4_ = iVar41;
      auVar68._8_4_ = iVar53;
      auVar68._12_4_ = iVar53;
      auVar60 = pshuflw(in_XMM12,auVar68,0xe8);
      auVar42._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar42._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
      auVar42._0_4_ = auVar42._4_4_;
      auVar42._8_4_ = auVar42._12_4_;
      auVar55 = pshuflw(in_XMM10,auVar42,0xe8);
      auVar35._4_4_ = iVar52;
      auVar35._0_4_ = iVar52;
      auVar35._8_4_ = iVar54;
      auVar35._12_4_ = iVar54;
      auVar37 = pshuflw(_DAT_012acff0,auVar35,0xe8);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar37 | auVar55 & auVar60) ^ auVar34;
      auVar34 = packssdw(auVar34,auVar34);
      local_48 = lVar67;
      lStack_40 = lVar75;
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 3] = (char)(uVar9 >> (((char)uVar14 + -1) * '\b' & 0x3fU));
      }
      auVar35 = auVar42 & auVar68 | auVar35;
      auVar34 = packssdw(auVar35,auVar35);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar37,auVar34 ^ auVar37);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 4] = (char)(uVar9 >> ((byte)((int)(lVar15 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0132e0c0) ^ _DAT_012acff0;
      iVar41 = -(uint)(iVar65 < auVar34._0_4_);
      iVar53 = -(uint)(iVar66 < auVar34._4_4_);
      iVar52 = -(uint)(iVar39 < auVar34._8_4_);
      iVar54 = -(uint)(iVar40 < auVar34._12_4_);
      auVar60._4_4_ = iVar41;
      auVar60._0_4_ = iVar41;
      auVar60._8_4_ = iVar52;
      auVar60._12_4_ = iVar52;
      iVar41 = -(uint)(auVar34._4_4_ == iVar66);
      iVar52 = -(uint)(auVar34._12_4_ == iVar40);
      auVar69._4_4_ = iVar41;
      auVar69._0_4_ = iVar41;
      auVar69._8_4_ = iVar52;
      auVar69._12_4_ = iVar52;
      auVar61._4_4_ = iVar53;
      auVar61._0_4_ = iVar53;
      auVar61._8_4_ = iVar54;
      auVar61._12_4_ = iVar54;
      auVar34 = auVar69 & auVar60 | auVar61;
      auVar34 = packssdw(auVar34,auVar34);
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar55,auVar34 ^ auVar55);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x10 & 1) != 0) {
        blob_00[uVar10 + 5] = (char)(uVar9 >> (((char)lVar76 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar60,0x84);
      auVar42 = pshufhw(auVar60,auVar69,0x84);
      auVar37 = pshufhw(auVar34,auVar61,0x84);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar16 = (auVar37 | auVar42 & auVar34) ^ auVar16;
      auVar34 = packssdw(auVar16,auVar16);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._0_4_ >> 0x18 & 1) != 0) {
        blob_00[uVar10 + 6] = (char)(uVar9 >> ((byte)((int)(lVar77 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0132e0f0) ^ _DAT_012acff0;
      auVar56._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar56._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar56._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
      auVar56._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
      auVar70._4_4_ = auVar56._0_4_;
      auVar70._0_4_ = auVar56._0_4_;
      auVar70._8_4_ = auVar56._8_4_;
      auVar70._12_4_ = auVar56._8_4_;
      auVar42 = pshuflw(auVar61,auVar70,0xe8);
      auVar17._0_4_ = -(uint)(auVar34._0_4_ == iVar65);
      auVar17._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar17._8_4_ = -(uint)(auVar34._8_4_ == iVar39);
      auVar17._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
      auVar43._4_4_ = auVar17._4_4_;
      auVar43._0_4_ = auVar17._4_4_;
      auVar43._8_4_ = auVar17._12_4_;
      auVar43._12_4_ = auVar17._12_4_;
      auVar34 = pshuflw(auVar17,auVar43,0xe8);
      auVar44._4_4_ = auVar56._4_4_;
      auVar44._0_4_ = auVar56._4_4_;
      auVar44._8_4_ = auVar56._12_4_;
      auVar44._12_4_ = auVar56._12_4_;
      auVar37 = pshuflw(auVar56,auVar44,0xe8);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 & auVar42,(auVar37 | auVar34 & auVar42) ^ auVar1);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 7] = (char)(uVar9 >> (((char)lVar32 + -1) * '\b' & 0x3fU));
      }
      auVar44 = auVar43 & auVar70 | auVar44;
      auVar37 = packssdw(auVar44,auVar44);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34,auVar37 ^ auVar2);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._4_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 8] = (char)(uVar9 >> ((byte)((int)(lVar33 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0132e0e0) ^ _DAT_012acff0;
      iVar41 = -(uint)(iVar65 < auVar34._0_4_);
      iVar53 = -(uint)(iVar66 < auVar34._4_4_);
      iVar52 = -(uint)(iVar39 < auVar34._8_4_);
      iVar54 = -(uint)(iVar40 < auVar34._12_4_);
      auVar45._4_4_ = iVar41;
      auVar45._0_4_ = iVar41;
      auVar45._8_4_ = iVar52;
      auVar45._12_4_ = iVar52;
      iVar41 = -(uint)(auVar34._4_4_ == iVar66);
      iVar52 = -(uint)(auVar34._12_4_ == iVar40);
      auVar62._4_4_ = iVar41;
      auVar62._0_4_ = iVar41;
      auVar62._8_4_ = iVar52;
      auVar62._12_4_ = iVar52;
      auVar71._4_4_ = iVar53;
      auVar71._0_4_ = iVar53;
      auVar71._8_4_ = iVar54;
      auVar71._12_4_ = iVar54;
      auVar34 = auVar62 & auVar45 | auVar71;
      auVar34 = packssdw(auVar34,auVar34);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar3,auVar34 ^ auVar3);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 9] = (char)(uVar9 >> (((char)lVar30 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar45,0x84);
      auVar42 = pshufhw(auVar45,auVar62,0x84);
      auVar37 = pshufhw(auVar34,auVar71,0x84);
      auVar18._8_4_ = 0xffffffff;
      auVar18._0_8_ = 0xffffffffffffffff;
      auVar18._12_4_ = 0xffffffff;
      auVar18 = (auVar37 | auVar42 & auVar34) ^ auVar18;
      auVar34 = packssdw(auVar18,auVar18);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._6_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 10] = (char)(uVar9 >> ((byte)((int)(lVar31 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0134e250) ^ _DAT_012acff0;
      auVar57._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar57._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar57._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
      auVar57._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
      auVar72._4_4_ = auVar57._0_4_;
      auVar72._0_4_ = auVar57._0_4_;
      auVar72._8_4_ = auVar57._8_4_;
      auVar72._12_4_ = auVar57._8_4_;
      auVar42 = pshuflw(auVar62,auVar72,0xe8);
      auVar19._0_4_ = -(uint)(auVar34._0_4_ == iVar65);
      auVar19._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar19._8_4_ = -(uint)(auVar34._8_4_ == iVar39);
      auVar19._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
      auVar46._4_4_ = auVar19._4_4_;
      auVar46._0_4_ = auVar19._4_4_;
      auVar46._8_4_ = auVar19._12_4_;
      auVar46._12_4_ = auVar19._12_4_;
      auVar34 = pshuflw(auVar19,auVar46,0xe8);
      auVar47._4_4_ = auVar57._4_4_;
      auVar47._0_4_ = auVar57._4_4_;
      auVar47._8_4_ = auVar57._12_4_;
      auVar47._12_4_ = auVar57._12_4_;
      auVar37 = pshuflw(auVar57,auVar47,0xe8);
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar58 = (auVar37 | auVar34 & auVar42) ^ auVar58;
      auVar37 = packssdw(auVar58,auVar58);
      auVar34 = packsswb(auVar34 & auVar42,auVar37);
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xb] = (char)(uVar9 >> (((char)lVar28 + -1) * '\b' & 0x3fU));
      }
      auVar47 = auVar46 & auVar72 | auVar47;
      auVar37 = packssdw(auVar47,auVar47);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar37 = packssdw(auVar37 ^ auVar4,auVar37 ^ auVar4);
      auVar34 = packsswb(auVar34,auVar37);
      if ((auVar34._8_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0xc] = (char)(uVar9 >> ((byte)((int)(lVar29 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0134e240) ^ _DAT_012acff0;
      iVar41 = -(uint)(iVar65 < auVar34._0_4_);
      iVar53 = -(uint)(iVar66 < auVar34._4_4_);
      iVar52 = -(uint)(iVar39 < auVar34._8_4_);
      iVar54 = -(uint)(iVar40 < auVar34._12_4_);
      auVar48._4_4_ = iVar41;
      auVar48._0_4_ = iVar41;
      auVar48._8_4_ = iVar52;
      auVar48._12_4_ = iVar52;
      iVar41 = -(uint)(auVar34._4_4_ == iVar66);
      iVar52 = -(uint)(auVar34._12_4_ == iVar40);
      auVar63._4_4_ = iVar41;
      auVar63._0_4_ = iVar41;
      auVar63._8_4_ = iVar52;
      auVar63._12_4_ = iVar52;
      auVar73._4_4_ = iVar53;
      auVar73._0_4_ = iVar53;
      auVar73._8_4_ = iVar54;
      auVar73._12_4_ = iVar54;
      auVar34 = auVar63 & auVar48 | auVar73;
      auVar34 = packssdw(auVar34,auVar34);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar5,auVar34 ^ auVar5);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xd] = (char)(uVar9 >> (((char)lVar26 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar48,0x84);
      auVar42 = pshufhw(auVar48,auVar63,0x84);
      auVar37 = pshufhw(auVar34,auVar73,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar37 | auVar42 & auVar34) ^ auVar20;
      auVar34 = packssdw(auVar20,auVar20);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._10_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0xe] = (char)(uVar9 >> ((byte)((int)(lVar27 + -1) << 3) & 0x3f));
      }
      auVar34 = (auVar64 | _DAT_0134e230) ^ _DAT_012acff0;
      auVar59._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar59._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar59._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
      auVar59._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
      auVar74._4_4_ = auVar59._0_4_;
      auVar74._0_4_ = auVar59._0_4_;
      auVar74._8_4_ = auVar59._8_4_;
      auVar74._12_4_ = auVar59._8_4_;
      auVar42 = pshuflw(auVar63,auVar74,0xe8);
      auVar21._0_4_ = -(uint)(auVar34._0_4_ == iVar65);
      auVar21._4_4_ = -(uint)(auVar34._4_4_ == iVar66);
      auVar21._8_4_ = -(uint)(auVar34._8_4_ == iVar39);
      auVar21._12_4_ = -(uint)(auVar34._12_4_ == iVar40);
      auVar49._4_4_ = auVar21._4_4_;
      auVar49._0_4_ = auVar21._4_4_;
      auVar49._8_4_ = auVar21._12_4_;
      auVar49._12_4_ = auVar21._12_4_;
      auVar34 = pshuflw(auVar21,auVar49,0xe8);
      auVar50._4_4_ = auVar59._4_4_;
      auVar50._0_4_ = auVar59._4_4_;
      auVar50._8_4_ = auVar59._12_4_;
      auVar50._12_4_ = auVar59._12_4_;
      auVar37 = pshuflw(auVar59,auVar50,0xe8);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 & auVar42,(auVar37 | auVar34 & auVar42) ^ auVar6);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0xf] = (char)(uVar9 >> (((char)lVar24 + -1) * '\b' & 0x3fU));
      }
      auVar50 = auVar49 & auVar74 | auVar50;
      auVar37 = packssdw(auVar50,auVar50);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34,auVar37 ^ auVar7);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._12_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0x10] = (char)(uVar9 >> ((byte)((int)(lVar25 + -1) << 3) & 0x3f));
      }
      lVar75 = lStack_40;
      lVar67 = local_48;
      lVar36 = lStack_40 + -1;
      auVar34 = (auVar64 | _DAT_0134e220) ^ _DAT_012acff0;
      auVar22._0_4_ = -(uint)(iVar65 < auVar34._0_4_);
      auVar22._4_4_ = -(uint)(iVar66 < auVar34._4_4_);
      auVar22._8_4_ = -(uint)(iVar39 < auVar34._8_4_);
      auVar22._12_4_ = -(uint)(iVar40 < auVar34._12_4_);
      auVar51._4_4_ = auVar22._0_4_;
      auVar51._0_4_ = auVar22._0_4_;
      auVar51._8_4_ = auVar22._8_4_;
      auVar51._12_4_ = auVar22._8_4_;
      iVar65 = -(uint)(auVar34._4_4_ == iVar66);
      iVar66 = -(uint)(auVar34._12_4_ == iVar40);
      auVar38._4_4_ = iVar65;
      auVar38._0_4_ = iVar65;
      auVar38._8_4_ = iVar66;
      auVar38._12_4_ = iVar66;
      in_XMM12._4_4_ = auVar22._4_4_;
      in_XMM12._0_4_ = auVar22._4_4_;
      in_XMM12._8_4_ = auVar22._12_4_;
      in_XMM12._12_4_ = auVar22._12_4_;
      in_XMM10 = auVar38 & auVar51 | in_XMM12;
      auVar34 = packssdw(auVar22,in_XMM10);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar34 = packssdw(auVar34 ^ auVar8,auVar34 ^ auVar8);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        blob_00[uVar10 + 0x11] = (char)(uVar9 >> (((char)local_48 + -1) * '\b' & 0x3fU));
      }
      auVar34 = pshufhw(auVar34,auVar51,0x84);
      auVar42 = pshufhw(auVar38,auVar38,0x84);
      auVar37 = pshufhw(auVar34,in_XMM12,0x84);
      auVar23._8_4_ = 0xffffffff;
      auVar23._0_8_ = 0xffffffffffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar23 = (auVar37 | auVar42 & auVar34) ^ auVar23;
      auVar34 = packssdw(auVar23,auVar23);
      auVar34 = packsswb(auVar34,auVar34);
      if ((auVar34._14_2_ >> 8 & 1) != 0) {
        blob_00[uVar10 + 0x12] = (char)(uVar9 >> ((byte)((int)lVar36 << 3) & 0x3f));
      }
      uVar10 = uVar10 + 0x10;
      uVar14 = uVar14 - 0x10;
      lVar15 = lVar15 + -0x10;
      lVar76 = lVar76 + -0x10;
      lVar77 = lVar77 + -0x10;
      lVar32 = lVar32 + -0x10;
      lVar33 = lVar33 + -0x10;
      lVar30 = lVar30 + -0x10;
      lVar31 = lVar31 + -0x10;
      lVar28 = lVar28 + -0x10;
      lVar29 = lVar29 + -0x10;
      lVar26 = lVar26 + -0x10;
      lVar27 = lVar27 + -0x10;
      lVar24 = lVar24 + -0x10;
      lVar25 = lVar25 + -0x10;
      lVar67 = lVar67 + -0x10;
      lVar75 = lVar75 + -0x10;
    } while (((ulong)&(vector->type).field_0x4 & 0xfffffffffffffff0) != uVar10);
  }
  uVar9 = (ulong)(uint)local_68._0_4_;
  if (uVar9 < 0xd) {
    switchD_00569a20::default(local_68 + 4 + uVar9,0,0xc - uVar9);
  }
  else {
    local_68._4_4_ = *(undefined4 *)local_68._8_8_;
  }
  sVar78.value.pointer.ptr = (char *)local_68._8_8_;
  sVar78.value._0_8_ = local_68._0_8_;
  return (string_t)sVar78.value;
}

Assistant:

string_t IntToVarInt(Vector &result, T int_value) {
	// Determine if the number is negative
	bool is_negative = int_value < 0;
	// Determine the number of data bytes
	uint64_t abs_value;
	if (is_negative) {
		if (int_value == std::numeric_limits<T>::min()) {
			abs_value = static_cast<uint64_t>(std::numeric_limits<T>::max()) + 1;
		} else {
			abs_value = static_cast<uint64_t>(std::abs(static_cast<int64_t>(int_value)));
		}
	} else {
		abs_value = static_cast<uint64_t>(int_value);
	}
	uint32_t data_byte_size;
	if (abs_value != NumericLimits<uint64_t>::Maximum()) {
		data_byte_size = (abs_value == 0) ? 1 : static_cast<uint32_t>(std::ceil(std::log2(abs_value + 1) / 8.0));
	} else {
		data_byte_size = static_cast<uint32_t>(std::ceil(std::log2(abs_value) / 8.0));
	}

	uint32_t blob_size = data_byte_size + Varint::VARINT_HEADER_SIZE;
	auto blob = StringVector::EmptyString(result, blob_size);
	auto writable_blob = blob.GetDataWriteable();
	Varint::SetHeader(writable_blob, data_byte_size, is_negative);

	// Add data bytes to the blob, starting off after header bytes
	idx_t wb_idx = Varint::VARINT_HEADER_SIZE;
	for (int i = static_cast<int>(data_byte_size) - 1; i >= 0; --i) {
		if (is_negative) {
			writable_blob[wb_idx++] = static_cast<char>(~(abs_value >> i * 8 & 0xFF));
		} else {
			writable_blob[wb_idx++] = static_cast<char>(abs_value >> i * 8 & 0xFF);
		}
	}
	blob.Finalize();
	return blob;
}